

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O1

void __thiscall
dynet::SimpleRNNBuilder::SimpleRNNBuilder
          (SimpleRNNBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model,bool support_lags)

{
  ParameterCollection *this_00;
  long lVar1;
  Parameter PVar2;
  Parameter PVar3;
  Parameter PVar4;
  ulong uVar5;
  uint uVar6;
  initializer_list<dynet::Parameter> __l;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  string local_150;
  SimpleRNNBuilder *local_130;
  ParameterCollection *local_128;
  uint local_11c;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> local_118;
  uint local_fc;
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  *local_f8;
  Parameter local_f0;
  uint local_e8 [2];
  pointer local_e0;
  ulong local_d8;
  ParameterCollection local_d0;
  
  (this->super_RNNBuilder).cur = -1;
  (this->super_RNNBuilder).sm.q_ = CREATED;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__SimpleRNNBuilder_005c0110;
  local_f8 = &this->params;
  local_128 = &this->local_model;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParameterCollection::ParameterCollection(local_128);
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->layers = layers;
  this->lagging = support_lags;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_130 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"simple-rnn-builder","");
  ParameterCollection::add_subcollection(&local_d0,model,&local_150);
  std::__cxx11::string::_M_assign((string *)local_128);
  if (&local_d0 != local_128) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->local_model).name_cntr,&local_d0.name_cntr._M_h);
    if (&local_d0 != local_128) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&(this->local_model).collec_name_cntr,&local_d0.collec_name_cntr._M_h);
    }
  }
  (this->local_model).storage = local_d0.storage;
  (this->local_model).parent = local_d0.parent;
  ParameterCollection::~ParameterCollection(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (layers != 0) {
    local_d8 = 0;
    local_e0 = (pointer)&PTR__ParameterInit_005bfae0;
    local_11c = hidden_dim;
    local_fc = layers;
    do {
      this_00 = local_128;
      local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(input_dim,hidden_dim);
      local_d0._28_8_ = 0x100000000;
      lVar1 = 0;
      do {
        uVar5 = local_d0._28_8_ & 0xffffffff;
        local_d0.name.field_2._12_4_ = local_d0.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_d0.name._M_dataplus._M_p + uVar5 * 4) =
             *(undefined4 *)
              ((long)&local_118.
                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
      PVar2 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_d0,0.0,&local_150,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_d0._28_8_ = 0x100000000;
      lVar1 = 0;
      do {
        uVar5 = local_d0._28_8_ & 0xffffffff;
        local_d0.name.field_2._12_4_ = local_d0.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_d0.name._M_dataplus._M_p + uVar5 * 4) =
             *(undefined4 *)
              ((long)&local_118.
                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
      PVar3 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_d0,0.0,&local_150,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_d0._28_8_ = 0x100000001;
      local_d0.name._M_dataplus._M_p._0_4_ = local_11c;
      local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
      super__Vector_impl_data._M_start = local_e0;
      local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_118.
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
      PVar4 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_d0,(ParameterInit *)&local_118,&local_150,
                         dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      __l._M_len = 3;
      __l._M_array = (iterator)&local_d0;
      local_d0.name._M_dataplus._M_p = (pointer)PVar2;
      local_d0.name._M_string_length = (size_type)PVar3;
      local_d0.name.field_2._M_allocated_capacity = (size_type)PVar4;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
                (&local_118,__l,(allocator_type *)&local_150);
      hidden_dim = local_11c;
      this = local_130;
      if (local_130->lagging == true) {
        local_e8[0] = local_11c;
        local_e8[1] = local_11c;
        local_d0._28_8_ = 0x100000000;
        lVar1 = 0;
        do {
          uVar5 = local_d0._28_8_ & 0xffffffff;
          local_d0.name.field_2._12_4_ = local_d0.name.field_2._12_4_ + 1;
          *(undefined4 *)((long)&local_d0.name._M_dataplus._M_p + uVar5 * 4) =
               *(undefined4 *)((long)local_e8 + lVar1);
          lVar1 = lVar1 + 4;
        } while (lVar1 != 8);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
        local_f0 = ParameterCollection::add_parameters
                             (local_128,(Dim *)&local_d0,0.0,&local_150,dynet::default_device);
        if (local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::
          _M_realloc_insert<dynet::Parameter>
                    (&local_118,
                     (iterator)
                     local_118.
                     super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl
                     .super__Vector_impl_data._M_finish,&local_f0);
        }
        else {
          (local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl
           .super__Vector_impl_data._M_finish)->p = local_f0.p;
          local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
      }
      std::
      vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
      ::push_back(local_f8,&local_118);
      uVar5 = local_d8;
      if (local_118.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar6 = (int)uVar5 + 1;
      local_d8 = (ulong)uVar6;
      input_dim = hidden_dim;
    } while (uVar6 != local_fc);
  }
  (this->super_RNNBuilder).dropout_rate = 0.0;
  return;
}

Assistant:

SimpleRNNBuilder::SimpleRNNBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       ParameterCollection& model,
                       bool support_lags) : layers(layers), lagging(support_lags) {
  local_model = model.add_subcollection("simple-rnn-builder");
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    Parameter p_x2h = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2h = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_hb = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    vector<Parameter> ps = {p_x2h, p_h2h, p_hb};
    if (lagging)
        ps.push_back(local_model.add_parameters({hidden_dim, hidden_dim}));
    params.push_back(ps);
    layer_input_dim = hidden_dim;
  }
  dropout_rate = 0.f;
}